

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-ipv6.c
# Opt level: O0

int is_from_client(sockaddr *addr)

{
  int iVar1;
  int64_t eval_b;
  int64_t eval_a;
  char local_128 [4];
  int r;
  char dst [256];
  sockaddr_in6 *addr6;
  sockaddr *addr_local;
  
  if (addr != (sockaddr *)0x0) {
    if ((ulong)addr->sa_family != 10) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-ipv6.c"
              ,0x5f,"addr->sa_family","==","10",(ulong)addr->sa_family,"==",10);
      abort();
    }
    dst._248_8_ = addr;
    iVar1 = uv_inet_ntop((uint)addr->sa_family,addr->sa_data + 6,local_128,0x100);
    if (iVar1 == 0) {
      printf("from [%.*s]:%d\n",0x100,local_128,(ulong)*(ushort *)(dst._248_8_ + 2));
    }
    if (*(uint16_t *)(dst._248_8_ + 2) != client_port) {
      return 0;
    }
    if ((iVar1 != 0) || (iVar1 = strcmp(local_128,"::ffff:127.0.0.1"), iVar1 != 0)) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int is_from_client(const struct sockaddr* addr) {
  const struct sockaddr_in6* addr6;
  char dst[256];
  int r;

  /* Debugging output, and filter out unwanted network traffic */
  if (addr != NULL) {
    ASSERT_EQ(addr->sa_family, AF_INET6);
    addr6 = (struct sockaddr_in6*) addr;
    r = uv_inet_ntop(addr->sa_family, &addr6->sin6_addr, dst, sizeof(dst));
    if (r == 0)
      printf("from [%.*s]:%d\n", (int) sizeof(dst), dst, addr6->sin6_port);
    if (addr6->sin6_port != client_port)
      return 0;
    if (r != 0 || strcmp(dst, "::ffff:127.0.0.1"))
      return 0;
  }
  return 1;
}